

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VulkanHppGenerator.cpp
# Opt level: O3

void __thiscall VulkanHppGenerator::checkCommandCorrectness(VulkanHppGenerator *this)

{
  _Rb_tree_color line;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Base_ptr p_Var2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  _Base_ptr p_Var9;
  _Rb_tree_node_base *p_Var10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ec;
  byte bVar12;
  ParamData *p;
  _Base_ptr p_Var13;
  _Base_ptr p_Var14;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultCodes;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  _Base_ptr local_90;
  _Base_ptr local_88;
  VulkanHppGenerator *local_80;
  _Base_ptr local_78;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
  *local_70;
  _Base_ptr local_68;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  gatherResultCodes_abi_cxx11_
            ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_60,this);
  p_Var9 = (this->m_commands)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_68 = &(this->m_commands)._M_t._M_impl.super__Rb_tree_header._M_header;
  local_80 = this;
  if (p_Var9 != local_68) {
    local_70 = &this->m_types;
    local_78 = &(this->m_types)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      local_88 = p_Var9 + 1;
      p_Var13 = p_Var9[7]._M_parent;
      iVar5 = *(int *)&p_Var9[9]._M_parent;
      local_90 = p_Var9;
      std::operator+(&local_b0,"command <",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_b0,"> not required in any feature or extension");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar6->_M_dataplus)._M_p;
      paVar11 = &pbVar6->field_2;
      if (paVar1 == paVar11) {
        local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_d0._M_dataplus._M_p = (pointer)paVar1;
      }
      local_d0._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      checkForError(p_Var13 != (_Base_ptr)0x0,iVar5,&local_d0);
      p_Var9 = local_90;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      p_Var13 = p_Var9[3]._M_right;
      for (p_Var9 = p_Var9[3]._M_left; p_Var9 != p_Var13; p_Var9 = p_Var9 + 1) {
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_60,(key_type *)p_Var9);
        iVar5 = *(int *)&local_90[9]._M_parent;
        std::operator+(&local_b0,"command uses unknown error code <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var9);
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_b0,">");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar6->_M_dataplus)._M_p;
        paVar11 = &pbVar6->field_2;
        if (paVar1 == paVar11) {
          local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        }
        else {
          local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_d0._M_dataplus._M_p = (pointer)paVar1;
        }
        local_d0._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        checkForError((_Rb_tree_header *)cVar7._M_node != &local_60._M_impl.super__Rb_tree_header,
                      iVar5,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var13 = local_90[8]._M_right;
      for (p_Var9 = local_90[8]._M_left; p_Var14 = local_90, p_Var9 != p_Var13; p_Var9 = p_Var9 + 1)
      {
        cVar7 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::find(&local_60,(key_type *)p_Var9);
        iVar5 = *(int *)&local_90[9]._M_parent;
        std::operator+(&local_b0,"command uses unknown success code <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var9);
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_b0,">");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar6->_M_dataplus)._M_p;
        paVar11 = &pbVar6->field_2;
        if (paVar1 == paVar11) {
          local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        }
        else {
          local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_d0._M_dataplus._M_p = (pointer)paVar1;
        }
        local_d0._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        checkForError((_Rb_tree_header *)cVar7._M_node != &local_60._M_impl.super__Rb_tree_header,
                      iVar5,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      p_Var9 = local_90 + 7;
      iVar5 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              compare((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      &p_Var9->_M_left,"VkResult");
      if ((iVar5 == 0) && (p_Var14[8]._M_left == p_Var14[8]._M_right)) {
        p_Var10 = p_Var14[6]._M_right;
        if (p_Var10 != (_Rb_tree_node_base *)&p_Var14[6]._M_parent) {
          bVar12 = 0;
          do {
            bVar3 = isSupportedFeature(local_80,(string *)(p_Var10 + 1));
            bVar4 = true;
            if (!bVar3) {
              bVar4 = isSupportedExtension(local_80,(string *)(p_Var10 + 1));
            }
            bVar12 = bVar12 | bVar4;
            p_Var10 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var10);
          } while (p_Var10 != (_Rb_tree_node_base *)&p_Var14[6]._M_parent);
          p_Var14 = local_90;
          if (bVar12 != 0) {
            iVar5 = *(int *)&local_90[9]._M_parent;
            std::operator+(&local_b0,"missing successcodes on command <",
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_88);
            pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                     ::append(&local_b0,"> returning VkResult!");
            local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
            paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)(pbVar6->_M_dataplus)._M_p;
            paVar11 = &pbVar6->field_2;
            if (paVar1 == paVar11) {
              local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
            }
            else {
              local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
              local_d0._M_dataplus._M_p = (pointer)paVar1;
            }
            local_d0._M_string_length = pbVar6->_M_string_length;
            (pbVar6->_M_dataplus)._M_p = (pointer)paVar11;
            pbVar6->_M_string_length = 0;
            (pbVar6->field_2)._M_local_buf[0] = '\0';
            checkForError(false,iVar5,&local_d0);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            p_Var14 = local_90;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
              operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
              p_Var14 = local_90;
            }
          }
        }
      }
      p_Var2 = p_Var14[5]._M_left;
      local_88 = (_Base_ptr)&p_Var9->_M_left;
      for (p_Var13 = p_Var14[5]._M_parent; p_Var9 = local_88, p_Var13 != p_Var2;
          p_Var13 = (_Base_ptr)&p_Var13[8]._M_parent) {
        cVar8 = std::
                _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
                ::find(&local_70->_M_t,(key_type *)(p_Var13 + 1));
        line = p_Var13[8]._M_color;
        std::operator+(&local_b0,"comand uses parameter of unknown type <",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       (p_Var13 + 1));
        pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                 append(&local_b0,">");
        local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
        paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(pbVar6->_M_dataplus)._M_p;
        paVar11 = &pbVar6->field_2;
        if (paVar1 == paVar11) {
          local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
        }
        else {
          local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
          local_d0._M_dataplus._M_p = (pointer)paVar1;
        }
        local_d0._M_string_length = pbVar6->_M_string_length;
        (pbVar6->_M_dataplus)._M_p = (pointer)paVar11;
        pbVar6->_M_string_length = 0;
        (pbVar6->field_2)._M_local_buf[0] = '\0';
        checkForError(cVar8._M_node != local_78,line,&local_d0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
          operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
        }
      }
      cVar8 = std::
              _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_TypeData>_>_>
              ::find(&local_70->_M_t,(key_type *)local_88);
      p_Var13 = local_90;
      iVar5 = *(int *)&local_90[9]._M_parent;
      std::operator+(&local_b0,"command uses unknown return type <",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)p_Var9);
      pbVar6 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
               append(&local_b0,">");
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
      paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(pbVar6->_M_dataplus)._M_p;
      paVar11 = &pbVar6->field_2;
      if (paVar1 == paVar11) {
        local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_d0.field_2._8_8_ = *(undefined8 *)((long)&pbVar6->field_2 + 8);
      }
      else {
        local_d0.field_2._M_allocated_capacity = paVar11->_M_allocated_capacity;
        local_d0._M_dataplus._M_p = (pointer)paVar1;
      }
      local_d0._M_string_length = pbVar6->_M_string_length;
      (pbVar6->_M_dataplus)._M_p = (pointer)paVar11;
      pbVar6->_M_string_length = 0;
      (pbVar6->field_2)._M_local_buf[0] = '\0';
      checkForError(cVar8._M_node != local_78,iVar5,&local_d0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
        operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
        operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
      }
      p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var13);
    } while (p_Var9 != local_68);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&local_60);
  return;
}

Assistant:

void VulkanHppGenerator::checkCommandCorrectness() const
{
  // prepare command checks by gathering all result codes (including aliases and not supported ones!) into one set of resultCodes
  std::set<std::string> resultCodes = gatherResultCodes();

  // command checks
  for ( auto const & command : m_commands )
  {
    // check that a command is referenced somewhere
    // I think, it's not forbidden to not reference a function, but it would probably be not intended?
    checkForError( !command.second.requiredBy.empty(), command.second.xmlLine, "command <" + command.first + "> not required in any feature or extension" );

    // check for unknown error or succes codes
    for ( auto const & ec : command.second.errorCodes )
    {
      checkForError( resultCodes.contains( ec ), command.second.xmlLine, "command uses unknown error code <" + ec + ">" );
    }
    for ( auto const & sc : command.second.successCodes )
    {
      checkForError( resultCodes.contains( sc ), command.second.xmlLine, "command uses unknown success code <" + sc + ">" );
    }

    // check that functions returning a VkResult specify successcodes
    if ( ( command.second.returnType == "VkResult" ) && command.second.successCodes.empty() )
    {
      // emit an error if this function is required in at least one supported feature or extension
      // disabled or not supported features/extensions are still listed in requiredBy, but not in m_features/m_extensions
      bool functionUsed = false;
      for ( auto const & require : command.second.requiredBy )
      {
        functionUsed |= isSupportedFeature( require ) || isSupportedExtension( require );
      }
      if ( functionUsed )
      {
        checkForError( false, command.second.xmlLine, "missing successcodes on command <" + command.first + "> returning VkResult!" );
      }
    }

    // check that all parameter types as well as the return type are known types
    for ( auto const & p : command.second.params )
    {
      checkForError( m_types.contains( p.type.type ), p.xmlLine, "comand uses parameter of unknown type <" + p.type.type + ">" );
    }
    checkForError(
      m_types.contains( command.second.returnType ), command.second.xmlLine, "command uses unknown return type <" + command.second.returnType + ">" );
  }
}